

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>
::
Intrusive_list_column<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>>>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>
           *this,Index columnIndex,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          *nonZeroRowIndices,Dimension dimension,
          map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  _Rb_tree_header *p_Var1;
  node_ptr plVar2;
  node_ptr plVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined8 in_RAX;
  long lVar6;
  pointer __v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>,Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>>
  *this_00;
  _Rb_tree_node_base *p_Var7;
  undefined8 local_38;
  
  *(Index *)this = columnIndex;
  *(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(Dimension *)(this + 0x10) = dimension;
  p_Var1 = &(nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header;
  local_38 = in_RAX;
  if ((_Rb_tree_header *)(nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
      == p_Var1) {
    uVar5 = 0xffffffff;
  }
  else {
    lVar6 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    uVar5 = *(undefined4 *)(lVar6 + 0x20);
  }
  *(undefined4 *)(this + 0x14) = uVar5;
  *(undefined4 *)(this + 0x18) = 0xffffffff;
  *(undefined8 *)(this + 0x20) = 0;
  *(Column_settings **)(this + 0x28) = colSettings;
  plVar2 = (node_ptr)(this + 0x30);
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(node_ptr *)(this + 0x30) = plVar2;
  *(node_ptr *)(this + 0x38) = plVar2;
  p_Var7 = (nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      return;
    }
    uVar4 = (ulong)local_38 >> 0x20;
    local_38 = CONCAT44((int)uVar4,p_Var7[1]._M_color);
    __v = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>
          ::construct<unsigned_int&,unsigned_int&>
                    (*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>
                       **)(this + 0x28),(uint *)this,(uint *)&local_38);
    if ((__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) break;
    plVar3 = *(node_ptr *)(this + 0x38);
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = plVar3;
    (__v->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = plVar2;
    *(Column_hook **)(this + 0x38) = &__v->super_Column_hook;
    plVar3->next_ = (node_ptr)&__v->super_Column_hook;
    local_38 = CONCAT44((uint)local_38,(uint)local_38);
    if (*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
          **)(this + 8) !=
        (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
         *)0x0) {
      this_00 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>,Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>>
                 *)std::
                   map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
                   ::operator[](*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_false>_>_>_>_>_>_>_>
                                  **)(this + 8),(key_type *)((long)&local_38 + 4));
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>,Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>>>
      ::
      _M_insert_unique<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,false>>>const&>
                (this_00,__v);
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                "/usr/include/boost/intrusive/list.hpp",0x33c,
                "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true, false, false>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true, false, false>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
               );
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Index columnIndex,
                                                                   const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Row_container* rowContainer,
                                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}